

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::get_min(uint argc)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  uint idx;
  ulong uVar4;
  long lVar5;
  vm_val_t cur_min;
  vm_val_t lst;
  vm_val_t ele;
  
  if (argc == 0) {
    err_throw(0x899);
  }
  cur_min.typ = sp_[-1].typ;
  cur_min._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  cur_min.val = sp_[-1].val;
  if ((argc == 1) && (iVar2 = vm_val_t::is_listlike(&cur_min), iVar2 != 0)) {
    lst.typ = cur_min.typ;
    lst._4_4_ = cur_min._4_4_;
    lst.val = cur_min.val;
    uVar3 = vm_val_t::ll_length(&lst);
    if (uVar3 == 0) {
      err_throw(0x902);
    }
    vm_val_t::ll_index(&lst,&cur_min,1);
    for (idx = 2; idx <= uVar3; idx = idx + 1) {
      vm_val_t::ll_index(&lst,&ele,idx);
      iVar2 = vm_val_t::compare_to(&ele,&cur_min);
      if (iVar2 < 0) {
        cur_min.typ = ele.typ;
        cur_min._4_4_ = ele._4_4_;
        cur_min.val = ele.val;
      }
    }
  }
  else {
    lVar5 = -0x20;
    for (uVar4 = 1; uVar4 < argc; uVar4 = uVar4 + 1) {
      iVar2 = vm_val_t::compare_to((vm_val_t *)((long)&sp_->typ + lVar5),&cur_min);
      if (iVar2 < 0) {
        puVar1 = (undefined8 *)((long)&sp_->typ + lVar5);
        cur_min._0_8_ = *puVar1;
        cur_min.val = *(anon_union_8_8_cb74652f_for_val *)(puVar1 + 1);
      }
      lVar5 = lVar5 + -0x10;
    }
  }
  sp_ = sp_ + -(long)(int)argc;
  CVmBif::retval(&cur_min);
  return;
}

Assistant:

void CVmBifTADS::get_min(VMG_ uint argc)
{
    uint i;
    vm_val_t cur_min;

    /* make sure we have at least one argument */
    if (argc < 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* start with the first argument as the presumptive minimum */
    cur_min = *G_stk->get(0);

    /* if there's one list-like argument, get the max of the list elements */
    if (argc == 1 && cur_min.is_listlike(vmg0_))
    {
        /* get the list length */
        vm_val_t lst = cur_min;
        uint cnt = lst.ll_length(vmg0_);

        /* if it's a zero-element list, it's an error */
        if (cnt == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* get the first element as the tentative maximum */
        lst.ll_index(vmg_ &cur_min, 1);

        /* compare each additional list element */
        for (i = 2 ; i <= cnt ; ++i)
        {
            /* compare the current element and keep it if it's the highest */
            vm_val_t ele;
            lst.ll_index(vmg_ &ele, i);
            if (ele.compare_to(vmg_ &cur_min) < 0)
                cur_min = ele;
        }
    }
    else
    {
        /* compare each argument in turn */
        for (i = 1 ; i < argc ; ++i)
        {
            /* 
             *   compare this value to the minimum so far; if this value is
             *   less, it becomes the new minimum so far 
             */
            if (G_stk->get(i)->compare_to(vmg_ &cur_min) < 0)
                cur_min = *G_stk->get(i);
        }
    }

    /* discard the arguments */
    G_stk->discard(argc);

    /* return the minimum value */
    retval(vmg_ &cur_min);
}